

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDAWBICMetropolisSampler.cpp
# Opt level: O0

double runWBICMetropolis(vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         *frequencyMatrix,
                        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        *docVoca,vector<double,_std::allocator<double>_> *alpha,
                        vector<double,_std::allocator<double>_> *beta,uint n)

{
  allocator<std::vector<double,_std::allocator<double>_>_> *paVar1;
  value_type *pvVar2;
  vector<double,_std::allocator<double>_> *pvVar3;
  uint uVar4;
  result_type_conflict rVar5;
  int iVar6;
  uint uVar7;
  size_type sVar8;
  const_reference this;
  const_reference pvVar9;
  ulong uVar10;
  reference pvVar11;
  reference pvVar12;
  ostream *poVar13;
  double dVar14;
  result_type rVar15;
  double randomValue;
  double acceptanceProb;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_29d8;
  double local_29c0;
  double logProposalDistributionValueToSample;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_29a0;
  double local_2988;
  double logProposalDistributionValueToCandidate;
  double logTargetDistributionValueCandidate;
  vector<double,_std::allocator<double>_> local_2960;
  double local_2948;
  double logPriorDistributionValueCandidate;
  double logLikelihoodCandidate;
  int v_3;
  int k_5;
  int k_4;
  int d_3;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  phiCandidate;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  thetaCandidate;
  uint local_28f0;
  int i;
  int v_2;
  int k_3;
  int k_2;
  int d_2;
  uint betaSum;
  uint alphaSum;
  uniform_real_distribution<double> randN;
  mt19937 mt;
  random_device rnd;
  double logTargetDistributionValue;
  vector<double,_std::allocator<double>_> local_198;
  double local_180;
  double logPriorDistributionValue;
  double logLikelihood;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  phi;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  theta;
  double logLikelihoodAverage;
  uint acceptanceTimes;
  uint samplingTimes;
  uint RATE;
  uint samplingInterval;
  uint burnIn;
  uint iteration;
  int v_1;
  int k_1;
  int k;
  int d_1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  betaMatrixUniform;
  undefined1 local_e8 [8];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  alphaMatrixUniform;
  undefined1 local_c8 [8];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  betaMatrixCandidate;
  undefined1 local_a8 [8];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  alphaMatrixCandidate;
  undefined1 local_88 [8];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  betaMatrix;
  allocator<std::vector<double,_std::allocator<double>_>_> local_59;
  undefined1 local_58 [8];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  alphaMatrix;
  int v;
  int d;
  uint V;
  uint K;
  uint D;
  uint n_local;
  vector<double,_std::allocator<double>_> *beta_local;
  vector<double,_std::allocator<double>_> *alpha_local;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *docVoca_local;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *frequencyMatrix_local;
  
  K = n;
  _D = beta;
  beta_local = alpha;
  alpha_local = (vector<double,_std::allocator<double>_> *)docVoca;
  docVoca_local = frequencyMatrix;
  sVar8 = std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::size(docVoca);
  V = (uint)sVar8;
  sVar8 = std::vector<double,_std::allocator<double>_>::size(beta_local);
  d = (int)sVar8;
  sVar8 = std::vector<double,_std::allocator<double>_>::size(_D);
  uVar4 = (uint)sVar8;
  if (K == 0) {
    for (alphaMatrix.
         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        alphaMatrix.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < V;
        alphaMatrix.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             alphaMatrix.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      for (alphaMatrix.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
          (uint)alphaMatrix.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage < uVar4;
          alphaMatrix.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
               (uint)alphaMatrix.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
        this = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](docVoca_local,
                            (long)(int)alphaMatrix.
                                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (this,(long)(int)(uint)alphaMatrix.
                                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                           );
        K = *pvVar9 + K;
      }
    }
  }
  pvVar3 = beta_local;
  uVar10 = (ulong)V;
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator(&local_59);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)local_58,uVar10,pvVar3,&local_59);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator(&local_59);
  pvVar2 = _D;
  uVar10 = (ulong)(uint)d;
  paVar1 = (allocator<std::vector<double,_std::allocator<double>_>_> *)
           ((long)&alphaMatrixCandidate.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator(paVar1);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)local_88,uVar10,pvVar2,paVar1);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)
             ((long)&alphaMatrixCandidate.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pvVar3 = beta_local;
  uVar10 = (ulong)V;
  paVar1 = (allocator<std::vector<double,_std::allocator<double>_>_> *)
           ((long)&betaMatrixCandidate.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator(paVar1);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)local_a8,uVar10,pvVar3,paVar1);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)
             ((long)&betaMatrixCandidate.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pvVar2 = _D;
  uVar10 = (ulong)(uint)d;
  paVar1 = (allocator<std::vector<double,_std::allocator<double>_>_> *)
           ((long)&alphaMatrixUniform.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator(paVar1);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)local_c8,uVar10,pvVar2,paVar1);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)
             ((long)&alphaMatrixUniform.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pvVar3 = beta_local;
  uVar10 = (ulong)V;
  paVar1 = (allocator<std::vector<double,_std::allocator<double>_>_> *)
           ((long)&betaMatrixUniform.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator(paVar1);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)local_e8,uVar10,pvVar3,paVar1);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)
             ((long)&betaMatrixUniform.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pvVar2 = _D;
  uVar10 = (ulong)(uint)d;
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)((long)&k + 3));
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)&d_1,uVar10,pvVar2,
           (allocator<std::vector<double,_std::allocator<double>_>_> *)((long)&k + 3));
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)((long)&k + 3));
  for (k_1 = 0; (uint)k_1 < V; k_1 = k_1 + 1) {
    for (v_1 = 0; (uint)v_1 < (uint)d; v_1 = v_1 + 1) {
      pvVar11 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              *)local_e8,(long)k_1);
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[](pvVar11,(long)v_1);
      *pvVar12 = 1.0;
    }
  }
  for (iteration = 0; iteration < (uint)d; iteration = iteration + 1) {
    for (burnIn = 0; burnIn < uVar4; burnIn = burnIn + 1) {
      pvVar11 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              *)&d_1,(long)(int)iteration);
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[](pvVar11,(long)(int)burnIn);
      *pvVar12 = 1.0;
    }
  }
  logLikelihoodAverage._4_4_ = 0;
  theta.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  samplingParamFromDirichlet
            ((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)&phi.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)local_e8,&V);
  samplingParamFromDirichlet
            ((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)&logLikelihood,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)&d_1,(uint *)&d);
  logPriorDistributionValue =
       calculateLogLikelihood
                 ((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)&phi.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)&logLikelihood,docVoca_local,
                  (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   *)alpha_local);
  std::vector<double,_std::allocator<double>_>::vector(&local_198,beta_local);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&logTargetDistributionValue,_D);
  dVar14 = calculateLogPriorDistributionValue
                     ((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)&phi.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)&logLikelihood,&local_198,
                      (vector<double,_std::allocator<double>_> *)&logTargetDistributionValue);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&logTargetDistributionValue);
  std::vector<double,_std::allocator<double>_>::~vector(&local_198);
  local_180 = dVar14;
  rnd.field_0._M_mt._M_p =
       (size_t)calculateLogTargetDistributionValue(&logPriorDistributionValue,&local_180,&K);
  std::random_device::random_device((random_device *)&mt._M_p);
  rVar5 = std::random_device::operator()((random_device *)&mt._M_p);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)&randN._M_param._M_b,(ulong)rVar5);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)&betaSum,0.0,1.0);
  iVar6 = d * 1000;
  for (k_3 = 0; (uint)k_3 < V; k_3 = k_3 + 1) {
    for (v_2 = 0; (uint)v_2 < (uint)d; v_2 = v_2 + 1) {
      pvVar11 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              *)&phi.
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)k_3);
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[](pvVar11,(long)v_2);
      dVar14 = *pvVar12;
      uVar7 = iVar6 - d;
      pvVar11 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              *)local_58,(long)k_3);
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[](pvVar11,(long)v_2);
      *pvVar12 = dVar14 * (double)uVar7 + 1.0;
    }
  }
  for (i = 0; (uint)i < (uint)d; i = i + 1) {
    for (local_28f0 = 0; local_28f0 < uVar4; local_28f0 = local_28f0 + 1) {
      pvVar11 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              *)&logLikelihood,(long)i);
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                          (pvVar11,(long)(int)local_28f0);
      dVar14 = *pvVar12;
      pvVar11 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              *)local_88,(long)i);
      pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                          (pvVar11,(long)(int)local_28f0);
      *pvVar12 = dVar14 * (double)(uVar4 * 999) + 1.0;
    }
  }
  for (thetaCandidate.
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      thetaCandidate.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 60000;
      thetaCandidate.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           thetaCandidate.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    samplingParamFromDirichlet
              ((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)&phiCandidate.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)local_58,&V);
    samplingParamFromDirichlet
              ((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)&k_4,(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        *)local_88,(uint *)&d);
    for (k_5 = 0; (uint)k_5 < V; k_5 = k_5 + 1) {
      for (v_3 = 0; (uint)v_3 < (uint)d; v_3 = v_3 + 1) {
        pvVar11 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                *)&phiCandidate.
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)k_5);
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[](pvVar11,(long)v_3);
        dVar14 = *pvVar12;
        uVar7 = iVar6 - d;
        pvVar11 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                *)local_a8,(long)k_5);
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[](pvVar11,(long)v_3);
        *pvVar12 = dVar14 * (double)uVar7 + 1.0;
      }
    }
    for (logLikelihoodCandidate._4_4_ = 0; logLikelihoodCandidate._4_4_ < (uint)d;
        logLikelihoodCandidate._4_4_ = logLikelihoodCandidate._4_4_ + 1) {
      for (logLikelihoodCandidate._0_4_ = 0; logLikelihoodCandidate._0_4_ < uVar4;
          logLikelihoodCandidate._0_4_ = logLikelihoodCandidate._0_4_ + 1) {
        pvVar11 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                *)&k_4,(long)(int)logLikelihoodCandidate._4_4_);
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            (pvVar11,(long)(int)logLikelihoodCandidate._0_4_);
        dVar14 = *pvVar12;
        pvVar11 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                *)local_c8,(long)(int)logLikelihoodCandidate._4_4_);
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            (pvVar11,(long)(int)logLikelihoodCandidate._0_4_);
        *pvVar12 = dVar14 * (double)(uVar4 * 999) + 1.0;
      }
    }
    logPriorDistributionValueCandidate =
         calculateLogLikelihood
                   ((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     *)&phiCandidate.
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     *)&k_4,docVoca_local,
                    (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     *)alpha_local);
    std::vector<double,_std::allocator<double>_>::vector(&local_2960,beta_local);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&logTargetDistributionValueCandidate,_D);
    dVar14 = calculateLogPriorDistributionValue
                       ((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)&phiCandidate.
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)&k_4,&local_2960,
                        (vector<double,_std::allocator<double>_> *)
                        &logTargetDistributionValueCandidate);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)&logTargetDistributionValueCandidate);
    std::vector<double,_std::allocator<double>_>::~vector(&local_2960);
    local_2948 = dVar14;
    logProposalDistributionValueToCandidate =
         calculateLogTargetDistributionValue(&logPriorDistributionValueCandidate,&local_2948,&K);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector(&local_29a0,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)local_58);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)&logProposalDistributionValueToSample,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)local_88);
    dVar14 = calculateLogProposalDistributionValue
                       ((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)&phiCandidate.
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)&k_4,&local_29a0,
                        (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)&logProposalDistributionValueToSample);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)&logProposalDistributionValueToSample);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_29a0);
    local_2988 = dVar14;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector(&local_29d8,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)local_a8);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)&acceptanceProb,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)local_c8);
    dVar14 = calculateLogProposalDistributionValue
                       ((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)&phi.
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)&logLikelihood,&local_29d8,
                        (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)&acceptanceProb);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)&acceptanceProb);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_29d8);
    local_29c0 = dVar14;
    dVar14 = exp(((logProposalDistributionValueToCandidate - (double)rnd.field_0._M_mt._M_p) +
                 dVar14) - local_2988);
    rVar15 = std::uniform_real_distribution<double>::operator()
                       ((uniform_real_distribution<double> *)&betaSum,
                        (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                         *)&randN._M_param._M_b);
    if (rVar15 < dVar14) {
      logLikelihoodAverage._4_4_ = logLikelihoodAverage._4_4_ + 1;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator=((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)&phi.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)&phiCandidate.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator=((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)&logLikelihood,
                  (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)&k_4);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator=((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)local_58,
                  (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)local_a8);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator=((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)local_88,
                  (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)local_c8);
      logPriorDistributionValue = logPriorDistributionValueCandidate;
      local_180 = local_2948;
      rnd.field_0._M_mt._M_p = (size_t)logProposalDistributionValueToCandidate;
    }
    if ((49999 < thetaCandidate.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) &&
       ((thetaCandidate.
         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ - 49999) % 100 == 0)) {
      theta.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)(logPriorDistributionValue +
                    (double)theta.
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)&k_4);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)&phiCandidate.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  poVar13 = std::operator<<((ostream *)&std::cout,"acceptanceTimes: ");
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,logLikelihoodAverage._4_4_);
  std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
  std::random_device::~random_device((random_device *)&mt._M_p);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&logLikelihood);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&phi.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&d_1);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)local_e8);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)local_c8);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)local_a8);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)local_88);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)local_58);
  return (double)theta.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage / 100.0;
}

Assistant:

double runWBICMetropolis(const vector<vector<unsigned int> > &frequencyMatrix, const vector<vector<unsigned int> > &docVoca, const vector<double> &alpha, const vector<double> &beta, unsigned int n){
    unsigned int D = docVoca.size(), K = alpha.size(), V = beta.size();
    if(n==0){
        for(int d=0; d<D; d++){
            for(int v=0; v<V; v++){
                n += frequencyMatrix[d][v];
            }
        }
    }
    vector<vector<double> > alphaMatrix(D, alpha);
    vector<vector<double> > betaMatrix(K, beta);
    vector<vector<double> > alphaMatrixCandidate(D, alpha);
    vector<vector<double> > betaMatrixCandidate(K, beta);
    vector<vector<double> > alphaMatrixUniform(D, alpha);
    vector<vector<double> > betaMatrixUniform(K, beta);
    for(int d=0; d<D; d++){
        for(int k=0; k<K; k++){
            alphaMatrixUniform[d][k] = 1;
        }
    }
    for(int k=0; k<K; k++){
        for(int v=0; v<V; v++){
            betaMatrixUniform[k][v] = 1;
        }
    }
    unsigned int iteration = 60000;
    unsigned int burnIn = 50000;
    unsigned int samplingInterval = 100;
    const unsigned int RATE = 1000;
    unsigned int samplingTimes = (iteration - burnIn) / samplingInterval;
    unsigned int acceptanceTimes = 0;
    double logLikelihoodAverage = 0.0;
    vector<vector<double> > theta = samplingParamFromDirichlet(alphaMatrixUniform, D);
    vector<vector<double> > phi = samplingParamFromDirichlet(betaMatrixUniform, K);
    double logLikelihood = calculateLogLikelihood(theta, phi, frequencyMatrix, docVoca);
    double logPriorDistributionValue = calculateLogPriorDistributionValue(theta, phi, alpha, beta);
    double logTargetDistributionValue = calculateLogTargetDistributionValue(logLikelihood, logPriorDistributionValue, n);
    // double logTargetDistributionValue = 0;
    random_device rnd;
    mt19937 mt(rnd());
    uniform_real_distribution<double> randN(0,1);
    const unsigned int alphaSum = RATE * K;
    const unsigned int betaSum = RATE * V;
    for(int d=0; d<D; d++){
        for(int k=0; k<K; k++){
            alphaMatrix[d][k] = theta[d][k] * (alphaSum - K) + 1;
        }
    }
    for(int k=0; k<K; k++){
        for(int v=0; v<V; v++){
            betaMatrix[k][v] = phi[k][v] * (betaSum - V) + 1;
        }
    }
    for(int i=0; i<iteration; i++){
        vector<vector<double> > thetaCandidate = samplingParamFromDirichlet(alphaMatrix, D);
        vector<vector<double> > phiCandidate = samplingParamFromDirichlet(betaMatrix, K);

        for(int d=0; d<D; d++){
            for(int k=0; k<K; k++){
                alphaMatrixCandidate[d][k] = thetaCandidate[d][k] * (alphaSum - K) + 1;
            }
        }
        for(int k=0; k<K; k++){
            for(int v=0; v<V; v++){
                betaMatrixCandidate[k][v] = phiCandidate[k][v] * (betaSum - V) + 1;
            }
        }
        double logLikelihoodCandidate = calculateLogLikelihood(thetaCandidate, phiCandidate, frequencyMatrix, docVoca);
        double logPriorDistributionValueCandidate = calculateLogPriorDistributionValue(thetaCandidate, phiCandidate, alpha, beta);
        double logTargetDistributionValueCandidate = calculateLogTargetDistributionValue(logLikelihoodCandidate, logPriorDistributionValueCandidate, n);
        double logProposalDistributionValueToCandidate = calculateLogProposalDistributionValue(thetaCandidate, phiCandidate, alphaMatrix, betaMatrix);
        double logProposalDistributionValueToSample = calculateLogProposalDistributionValue(theta, phi, alphaMatrixCandidate, betaMatrixCandidate);

        double acceptanceProb = exp(logTargetDistributionValueCandidate - logTargetDistributionValue + logProposalDistributionValueToSample - logProposalDistributionValueToCandidate);
        double randomValue = randN(mt);
        if(acceptanceProb > randomValue){
            acceptanceTimes += 1;
            theta = thetaCandidate;
            phi = phiCandidate;
            alphaMatrix = alphaMatrixCandidate;
            betaMatrix = betaMatrixCandidate;
            logLikelihood = logLikelihoodCandidate;
            logPriorDistributionValue = logPriorDistributionValueCandidate;
            logTargetDistributionValue = logTargetDistributionValueCandidate;
        }
        if((i > burnIn-1) && (i-burnIn+1)%samplingInterval == 0){
            logLikelihoodAverage += logLikelihood;
        }
    }
    logLikelihoodAverage /= samplingTimes;
    cout<<"acceptanceTimes: "<<acceptanceTimes<<endl;
    return logLikelihoodAverage;
}